

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O2

WriteAheadLogDeserializer *
duckdb::WriteAheadLogDeserializer::Open
          (WriteAheadLogDeserializer *__return_storage_ptr__,ReplayState *state_p,
          BufferedFileReader *stream,bool deserialize_only)

{
  ulong params_2;
  unsigned_long params_1;
  unsigned_long params_2_00;
  uint64_t params;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> buffer_00;
  uint64_t params_1_00;
  IOException *pIVar1;
  SerializationException *this;
  allocator local_71;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>,_true> buffer;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_58;
  string local_50;
  
  if (state_p->wal_version == 2) {
    params_1 = ReadStream::Read<unsigned_long>(&stream->super_ReadStream);
    params_2_00 = ReadStream::Read<unsigned_long>(&stream->super_ReadStream);
    params = BufferedFileReader::CurrentOffset(stream);
    params_2 = stream->file_size;
    if (params_2 < params + params_1) {
      this = (SerializationException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,
                 "Corrupt WAL file: entry size exceeded remaining data in file at byte position %llu (found entry with size %llu bytes, file size %llu bytes)"
                 ,(allocator *)&buffer);
      SerializationException::SerializationException<unsigned_long,unsigned_long,unsigned_long>
                (this,&local_50,params,params_1,params_2);
      __cxa_throw(this,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
    }
    buffer_00._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         operator_new__(params_1);
    buffer.super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
         (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
         buffer_00._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
         _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (**(stream->super_ReadStream)._vptr_ReadStream)
              (stream,buffer_00._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,params_1);
    params_1_00 = Checksum((uint8_t *)
                           buffer_00._M_t.
                           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,params_1);
    if (params_2_00 != params_1_00) {
      pIVar1 = (IOException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,
                 "Corrupt WAL file: entry at byte position %llu computed checksum %llu does not match stored checksum %llu"
                 ,&local_71);
      IOException::IOException<unsigned_long,unsigned_long,unsigned_long>
                (pIVar1,&local_50,params,params_1_00,params_2_00);
      __cxa_throw(pIVar1,&IOException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_58._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         buffer.super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    buffer.super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)0x0;
    WriteAheadLogDeserializer
              (__return_storage_ptr__,state_p,
               (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>,_true> *)&local_58,
               params_1,deserialize_only);
    ::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              (&local_58);
    ::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              (&buffer.super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>);
  }
  else {
    if (state_p->wal_version != 1) {
      pIVar1 = (IOException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,
                 "Failed to read WAL of version %llu - can only read version 1 and 2",
                 (allocator *)&buffer);
      IOException::IOException<unsigned_long>(pIVar1,&local_50,state_p->wal_version);
      __cxa_throw(pIVar1,&IOException::typeinfo,::std::runtime_error::~runtime_error);
    }
    WriteAheadLogDeserializer(__return_storage_ptr__,state_p,stream,deserialize_only);
  }
  return __return_storage_ptr__;
}

Assistant:

static WriteAheadLogDeserializer Open(ReplayState &state_p, BufferedFileReader &stream,
	                                      bool deserialize_only = false) {
		if (state_p.wal_version == 1) {
			// old WAL versions do not have checksums
			return WriteAheadLogDeserializer(state_p, stream, deserialize_only);
		}
		if (state_p.wal_version != 2) {
			throw IOException("Failed to read WAL of version %llu - can only read version 1 and 2",
			                  state_p.wal_version);
		}
		// read the checksum and size
		auto size = stream.Read<uint64_t>();
		auto stored_checksum = stream.Read<uint64_t>();
		auto offset = stream.CurrentOffset();
		auto file_size = stream.FileSize();

		if (offset + size > file_size) {
			throw SerializationException(
			    "Corrupt WAL file: entry size exceeded remaining data in file at byte position %llu "
			    "(found entry with size %llu bytes, file size %llu bytes)",
			    offset, size, file_size);
		}

		// allocate a buffer and read data into the buffer
		auto buffer = unique_ptr<data_t[]>(new data_t[size]);
		stream.ReadData(buffer.get(), size);

		// compute and verify the checksum
		auto computed_checksum = Checksum(buffer.get(), size);
		if (stored_checksum != computed_checksum) {
			throw IOException("Corrupt WAL file: entry at byte position %llu computed checksum %llu does not match "
			                  "stored checksum %llu",
			                  offset, computed_checksum, stored_checksum);
		}
		return WriteAheadLogDeserializer(state_p, std::move(buffer), size, deserialize_only);
	}